

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

BOOL js_get_fast_array(JSContext *ctx,JSValue obj,JSValue **arrpp,uint32_t *countp)

{
  BOOL BVar1;
  
  BVar1 = 0;
  if (((obj.u._0_4_ == -1) && ((ctx->header).dummy2 == 2)) && (((ctx->header).dummy1 & 8) != 0)) {
    *(undefined4 *)arrpp = *(undefined4 *)&ctx->class_proto;
    *(JSShape **)obj.tag = ctx->array_shape;
    BVar1 = 1;
  }
  return BVar1;
}

Assistant:

static BOOL js_get_fast_array(JSContext *ctx, JSValueConst obj,
                              JSValue **arrpp, uint32_t *countp)
{
    /* Try and handle fast arrays explicitly */
    if (JS_VALUE_GET_TAG(obj) == JS_TAG_OBJECT) {
        JSObject *p = JS_VALUE_GET_OBJ(obj);
        if (p->class_id == JS_CLASS_ARRAY && p->fast_array) {
            *countp = p->u.array.count;
            *arrpp = p->u.array.u.values;
            return TRUE;
        }
    }
    return FALSE;
}